

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  undefined1 auVar3 [16];
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  ImVec2 IVar7;
  undefined1 auVar9 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined1 auVar8 [16];
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 label_size;
  ImVec2 frame_padding_local;
  float local_88;
  float local_78;
  ImVec2 unsaved_marker_pos;
  ImVec2 local_50;
  ImVec2 IStack_48;
  ImVec2 local_40;
  ImVec2 IStack_38;
  undefined1 extraout_var [56];
  
  pIVar4 = GImGui;
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = frame_padding;
  auVar8 = auVar10._0_16_;
  frame_padding_local = (ImVec2)vmovlps_avx(auVar8);
  auVar11._0_8_ = CalcTextSize(label,(char *)0x0,true,-1.0);
  auVar11._8_56_ = extraout_var;
  label_size = (ImVec2)vmovlps_avx(auVar11._0_16_);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar12 = (bb->Min).x;
  fVar14 = (bb->Max).x;
  if (1.0 < fVar14 - fVar12) {
    auVar9 = vinsertps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)(bb->Min).y),0x10);
    fVar2 = frame_padding.x;
    auVar13._0_4_ = auVar9._0_4_ + fVar2;
    auVar13._4_4_ = auVar9._4_4_ + frame_padding.y;
    auVar13._8_4_ = auVar9._8_4_ + in_register_00001208._0_4_;
    auVar13._12_4_ = auVar9._12_4_ + in_register_00001208._4_4_;
    fVar14 = fVar14 - fVar2;
    fVar12 = (bb->Max).y;
    local_88 = auVar11._0_4_;
    if ((flags & 1U) != 0) {
      auVar9 = vmovshdup_avx(auVar8);
      IVar7 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar14 = fVar14 - IVar7.x;
      auVar3 = vminss_avx(ZEXT416((uint)(fVar2 + (bb->Min).x + local_88 + 2.0)),
                          ZEXT416((uint)fVar14));
      local_78 = auVar9._0_4_;
      auVar9 = vcvtdq2ps_avx(ZEXT416((uint)(int)(pIVar4->FontSize * -0.25)));
      unsaved_marker_pos.y = local_78 + (bb->Min).y + auVar9._0_4_;
      unsaved_marker_pos.x = auVar3._0_4_;
      auVar9._8_8_ = 0;
      auVar9._0_4_ = (bb->Max).x;
      auVar9._4_4_ = (bb->Max).y;
      auVar8 = vsubps_avx(auVar9,auVar8);
      local_b0 = (ImVec2)vmovlps_avx(auVar8);
      local_a0.x = 0.0;
      local_a0.y = 0.0;
      RenderTextClippedEx(draw_list,&unsaved_marker_pos,&local_b0,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_a0,(ImRect *)0x0);
    }
    local_b0 = (ImVec2)vmovlps_avx(auVar13);
    if (out_text_clipped != (bool *)0x0) {
      *out_text_clipped = fVar14 < auVar13._0_4_ + local_88;
    }
    local_a8.x = fVar14;
    local_a8.y = fVar12;
    if (((close_button_id == 0) ||
        ((!is_contents_visible &&
         ((bb->Max).x - (bb->Min).x < (pIVar4->Style).TabMinWidthForCloseButton)))) ||
       ((pIVar4->HoveredId != close_button_id && pIVar4->HoveredId != tab_id &&
        (pIVar4->ActiveId != tab_id && pIVar4->ActiveId != close_button_id)))) {
      fVar12 = (bb->Max).x + -1.0;
      bVar5 = false;
    }
    else {
      ImGuiLastItemDataBackup::ImGuiLastItemDataBackup
                ((ImGuiLastItemDataBackup *)&unsaved_marker_pos);
      fVar12 = pIVar4->FontSize;
      PushStyleVar(10,&frame_padding_local);
      local_a0.y = (bb->Min).y;
      local_a0.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) - fVar12;
      bVar5 = CloseButton(close_button_id,&local_a0);
      PopStyleVar(1);
      pIVar1 = GImGui->CurrentWindow;
      (pIVar1->DC).LastItemId = (ImGuiID)unsaved_marker_pos.x;
      (pIVar1->DC).LastItemStatusFlags = (ImGuiItemStatusFlags)unsaved_marker_pos.y;
      (pIVar1->DC).LastItemRect.Min = local_50;
      (pIVar1->DC).LastItemRect.Max = IStack_48;
      (pIVar1->DC).LastItemDisplayRect.Min = local_40;
      (pIVar1->DC).LastItemDisplayRect.Max = IStack_38;
      if ((flags & 4U) == 0) {
        bVar6 = IsMouseClicked(2,false);
        if (bVar6) {
          bVar5 = true;
        }
      }
      fVar14 = fVar14 - fVar12;
      fVar12 = fVar14;
    }
    RenderTextEllipsis(draw_list,&local_b0,&local_a8,fVar14,fVar12,label,(char *)0x0,&label_size);
    if (out_just_closed != (bool *)0x0) {
      *out_just_closed = bVar5;
    }
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiLastItemDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}